

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_int_&,_const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
* __thiscall
Catch::ExprLhs<int_const&>::operator>=
          (BinaryExpr<const_int_&,_const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
           *__return_storage_ptr__,ExprLhs<int_const&> *this,
          basic_optional<type_safe::direct_optional_storage<int>_> *rhs)

{
  int *lhs;
  bool comparisonResult;
  StringRef local_30;
  basic_optional<type_safe::direct_optional_storage<int>_> *local_20;
  basic_optional<type_safe::direct_optional_storage<int>_> *rhs_local;
  ExprLhs<const_int_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (basic_optional<type_safe::direct_optional_storage<int>_> *)this;
  this_local = (ExprLhs<const_int_&> *)__return_storage_ptr__;
  comparisonResult = type_safe::operator>=(*(int **)this,rhs);
  lhs = *(int **)this;
  StringRef::StringRef(&local_30,">=");
  BinaryExpr<const_int_&,_const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator >= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs >= rhs), m_lhs, ">=", rhs };
        }